

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall InterpTest_Rot13_Test::TestBody(InterpTest_Rot13_Test *this)

{
  Store *store;
  AssertionResult *pAVar1;
  int line;
  char *pcVar2;
  AssertionResult *this_00;
  AssertHelper local_410;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Result local_3dc;
  Ptr rot13;
  Values results;
  Ptr buf_done_func;
  Ptr memory;
  Ptr trap;
  Ptr host_func;
  Ptr fill_buf_func;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_318;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_2f8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_2d8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_2b8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_298;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_278;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_230;
  code *local_220;
  code *local_218;
  _Any_data local_210;
  code *local_200;
  code *local_1f8;
  string string_data;
  undefined1 local_11d [5];
  FuncType local_118;
  FuncType local_d8;
  FuncType local_98;
  MemoryType local_58;
  
  memcpy(&string_data,&DAT_0027d474,0xd3);
  host_func.obj_ = (HostFunc *)0x0;
  host_func.store_ = (Store *)0x0;
  host_func.root_index_ = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_initialize<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&host_func,&string_data,
             local_11d);
  InterpTest::ReadModule
            (&this->super_InterpTest,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&host_func);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&host_func);
  string_data._M_dataplus._M_p._0_4_ = 0xffffffff;
  store = &(this->super_InterpTest).store_;
  local_278._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_278,&string_data,
             (undefined1 *)((long)&string_data._M_dataplus._M_p + 4));
  memory.obj_._0_4_ = 0xffffffff;
  local_298._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_298,&memory);
  wabt::interp::FuncType::FuncType(&local_98,(ValueTypes *)&local_278,(ValueTypes *)&local_298);
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  local_240 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc:485:21)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc:485:21)>
              ::_M_manager;
  wabt::interp::HostFunc::New(&host_func,store,&local_98,(Callback *)&local_258);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  wabt::interp::FuncType::~FuncType(&local_98);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_298);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_278);
  std::__cxx11::string::string((string *)&string_data,"Hello, WebAssembly!",(allocator *)&memory);
  local_58.super_ExternType.kind = Memory;
  local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_002f3b50;
  local_58.limits.initial = 1;
  local_58.limits.has_max = false;
  local_58.limits.is_shared = false;
  local_58.limits.is_64 = false;
  local_58.limits.max = 0x10000;
  wabt::interp::Memory::New(&memory,store,&local_58);
  buf_done_func.obj_ = (HostFunc *)0xffffffffffffffff;
  local_2b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_2b8,&buf_done_func);
  rot13.obj_ = (DefinedFunc *)CONCAT44(rot13.obj_._4_4_,0xffffffff);
  local_2d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_2d8,&rot13);
  wabt::interp::FuncType::FuncType(&local_d8,(ValueTypes *)&local_2b8,(ValueTypes *)&local_2d8);
  local_1f8 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc:495:19)>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc:495:19)>
              ::_M_manager;
  local_210._M_unused._M_object = &string_data;
  local_210._8_8_ = &memory;
  wabt::interp::HostFunc::New(&fill_buf_func,store,&local_d8,(Callback *)&local_210);
  if (local_200 != (code *)0x0) {
    (*local_200)(&local_210,&local_210,__destroy_functor);
  }
  wabt::interp::FuncType::~FuncType(&local_d8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_2d8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_2b8);
  rot13.obj_ = (DefinedFunc *)0xffffffffffffffff;
  local_2f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_2f8,&rot13);
  local_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType(&local_118,(ValueTypes *)&local_2f8,(ValueTypes *)&local_318);
  local_230._8_8_ = &string_data;
  local_218 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc:517:19)>
              ::_M_invoke;
  local_220 = std::
              _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc:517:19)>
              ::_M_manager;
  local_230._M_unused._M_object = &memory;
  wabt::interp::HostFunc::New(&buf_done_func,store,&local_118,(Callback *)&local_230);
  if (local_220 != (code *)0x0) {
    (*local_220)(&local_230,&local_230,__destroy_functor);
  }
  wabt::interp::FuncType::~FuncType(&local_118);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_318);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_2f8);
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start =
       *(pointer *)(CONCAT44(memory.obj_._4_4_,memory.obj_._0_4_) + 0x38);
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((fill_buf_func.obj_)->super_Func).super_Extern.super_Object.self_.index;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((buf_done_func.obj_)->super_Func).super_Extern.super_Object.self_.index;
  rot13.obj_ = (DefinedFunc *)0x0;
  rot13.store_ = (Store *)0x0;
  rot13.root_index_ = 0;
  std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
  _M_range_initialize<wabt::interp::Ref_const*>
            ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)&rot13,&results);
  InterpTest::Instantiate(&this->super_InterpTest,(RefVec *)&rot13);
  std::_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&rot13);
  InterpTest::GetFuncExport(&rot13,&this->super_InterpTest,0);
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trap.root_index_ = 0;
  local_410.data_._0_4_ = 0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trap.obj_ = (Trap *)0x0;
  trap.store_ = (Store *)0x0;
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_7_ = 0;
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3dc = wabt::interp::Func::Call
                        (&(rot13.obj_)->super_Func,store,(Values *)&gtest_ar_1,&results,&trap,
                         (Stream *)0x0);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&gtest_ar,"Result::Ok","rot13->Call(store_, {}, results, &trap)",
             (Enum *)&local_410,&local_3dc);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&gtest_ar_1)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x21f;
LAB_001f280a:
    pAVar1 = &gtest_ar;
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,line,pcVar2);
    this_00 = &gtest_ar_1;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<char[20],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Uryyb, JroNffrzoyl!\"","string_data",
               (char (*) [20])"Uryyb, JroNffrzoyl!",&string_data);
    if (gtest_ar_1.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      local_410.data_._0_4_ = 0;
      gtest_ar_1.success_ = false;
      gtest_ar_1._1_7_ = 0;
      gtest_ar_1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_3dc = wabt::interp::Func::Call
                            (&(rot13.obj_)->super_Func,store,(Values *)&gtest_ar_1,&results,&trap,
                             (Stream *)0x0);
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                ((internal *)&gtest_ar,"Result::Ok","rot13->Call(store_, {}, results, &trap)",
                 (Enum *)&local_410,&local_3dc);
      std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
                ((_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                 &gtest_ar_1);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<char[20],std::__cxx11::string>
                  ((internal *)&gtest_ar_1,"\"Hello, WebAssembly!\"","string_data",
                   (char (*) [20])"Hello, WebAssembly!",&string_data);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar);
          if (gtest_ar_1.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_410,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
                     ,0x225,pcVar2);
          testing::internal::AssertHelper::operator=(&local_410,(Message *)&gtest_ar);
          testing::internal::AssertHelper::~AssertHelper(&local_410);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
        }
        pAVar1 = &gtest_ar_1;
        goto LAB_001f287f;
      }
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x223;
      goto LAB_001f280a;
    }
    testing::Message::Message((Message *)&gtest_ar);
    pAVar1 = &gtest_ar_1;
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x221,pcVar2);
    this_00 = &gtest_ar;
  }
  testing::internal::AssertHelper::operator=(&local_410,(Message *)this_00);
  testing::internal::AssertHelper::~AssertHelper(&local_410);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_001f287f:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
  ;
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::reset(&rot13);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&buf_done_func);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&fill_buf_func);
  wabt::interp::RefPtr<wabt::interp::Memory>::reset(&memory);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&host_func);
  return;
}

Assistant:

TEST_F(InterpTest, Rot13) {
  // (import "host" "mem" (memory $mem 1))
  // (import "host" "fill_buf" (func $fill_buf (param i32 i32) (result i32)))
  // (import "host" "buf_done" (func $buf_done (param i32 i32)))
  //
  // (func $rot13c (param $c i32) (result i32)
  //   (local $uc i32)
  //
  //   ;; No change if < 'A'.
  //   (if (i32.lt_u (get_local $c) (i32.const 65))
  //     (return (get_local $c)))
  //
  //   ;; Clear 5th bit of c, to force uppercase. 0xdf = 0b11011111
  //   (set_local $uc (i32.and (get_local $c) (i32.const 0xdf)))
  //
  //   ;; In range ['A', 'M'] return |c| + 13.
  //   (if (i32.le_u (get_local $uc) (i32.const 77))
  //     (return (i32.add (get_local $c) (i32.const 13))))
  //
  //   ;; In range ['N', 'Z'] return |c| - 13.
  //   (if (i32.le_u (get_local $uc) (i32.const 90))
  //     (return (i32.sub (get_local $c) (i32.const 13))))
  //
  //   ;; No change for everything else.
  //   (return (get_local $c))
  // )
  //
  // (func (export "rot13")
  //   (local $size i32)
  //   (local $i i32)
  //
  //   ;; Ask host to fill memory [0, 1024) with data.
  //   (call $fill_buf (i32.const 0) (i32.const 1024))
  //
  //   ;; The host returns the size filled.
  //   (set_local $size)
  //
  //   ;; Loop over all bytes and rot13 them.
  //   (block $exit
  //     (loop $top
  //       ;; if (i >= size) break
  //       (if (i32.ge_u (get_local $i) (get_local $size)) (br $exit))
  //
  //       ;; mem[i] = rot13c(mem[i])
  //       (i32.store8
  //         (get_local $i)
  //         (call $rot13c
  //           (i32.load8_u (get_local $i))))
  //
  //       ;; i++
  //       (set_local $i (i32.add (get_local $i) (i32.const 1)))
  //       (br $top)
  //     )
  //   )
  //
  //   (call $buf_done (i32.const 0) (get_local $size))
  // )
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x14, 0x04, 0x60,
      0x02, 0x7f, 0x7f, 0x01, 0x7f, 0x60, 0x02, 0x7f, 0x7f, 0x00, 0x60, 0x01,
      0x7f, 0x01, 0x7f, 0x60, 0x00, 0x00, 0x02, 0x2d, 0x03, 0x04, 0x68, 0x6f,
      0x73, 0x74, 0x03, 0x6d, 0x65, 0x6d, 0x02, 0x00, 0x01, 0x04, 0x68, 0x6f,
      0x73, 0x74, 0x08, 0x66, 0x69, 0x6c, 0x6c, 0x5f, 0x62, 0x75, 0x66, 0x00,
      0x00, 0x04, 0x68, 0x6f, 0x73, 0x74, 0x08, 0x62, 0x75, 0x66, 0x5f, 0x64,
      0x6f, 0x6e, 0x65, 0x00, 0x01, 0x03, 0x03, 0x02, 0x02, 0x03, 0x07, 0x09,
      0x01, 0x05, 0x72, 0x6f, 0x74, 0x31, 0x33, 0x00, 0x03, 0x0a, 0x74, 0x02,
      0x39, 0x01, 0x01, 0x7f, 0x20, 0x00, 0x41, 0xc1, 0x00, 0x49, 0x04, 0x40,
      0x20, 0x00, 0x0f, 0x0b, 0x20, 0x00, 0x41, 0xdf, 0x01, 0x71, 0x21, 0x01,
      0x20, 0x01, 0x41, 0xcd, 0x00, 0x4d, 0x04, 0x40, 0x20, 0x00, 0x41, 0x0d,
      0x6a, 0x0f, 0x0b, 0x20, 0x01, 0x41, 0xda, 0x00, 0x4d, 0x04, 0x40, 0x20,
      0x00, 0x41, 0x0d, 0x6b, 0x0f, 0x0b, 0x20, 0x00, 0x0f, 0x0b, 0x38, 0x01,
      0x02, 0x7f, 0x41, 0x00, 0x41, 0x80, 0x08, 0x10, 0x00, 0x21, 0x00, 0x02,
      0x40, 0x03, 0x40, 0x20, 0x01, 0x20, 0x00, 0x4f, 0x04, 0x40, 0x0c, 0x02,
      0x0b, 0x20, 0x01, 0x20, 0x01, 0x2d, 0x00, 0x00, 0x10, 0x02, 0x3a, 0x00,
      0x00, 0x20, 0x01, 0x41, 0x01, 0x6a, 0x21, 0x01, 0x0c, 0x00, 0x0b, 0x0b,
      0x41, 0x00, 0x20, 0x00, 0x10, 0x01, 0x0b,
  });

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [](Thread& thread, const Values& params, Values& results,
                       Trap::Ptr* out_trap) -> Result {
                      results[0] = Value::Make(params[0].Get<u32>() + 1);
                      return Result::Ok;
                    });

  std::string string_data = "Hello, WebAssembly!";

  auto memory = Memory::New(store_, MemoryType{Limits{1}});

  auto fill_buf = [&](Thread& thread, const Values& params, Values& results,
                      Trap::Ptr* out_trap) -> Result {
    // (param $ptr i32) (param $max_size i32) (result $size i32)
    EXPECT_EQ(2u, params.size());
    EXPECT_EQ(1u, results.size());

    u32 ptr = params[0].Get<u32>();
    u32 max_size = params[1].Get<u32>();
    u32 size = std::min(max_size, u32(string_data.size()));

    EXPECT_LT(ptr + size, memory->ByteSize());

    std::copy(string_data.begin(), string_data.begin() + size,
              memory->UnsafeData() + ptr);

    results[0].Set(size);
    return Result::Ok;
  };
  auto fill_buf_func = HostFunc::New(
      store_, FuncType{{ValueType::I32, ValueType::I32}, {ValueType::I32}},
      fill_buf);

  auto buf_done = [&](Thread& thread, const Values& params, Values& results,
                      Trap::Ptr* out_trap) -> Result {
    // (param $ptr i32) (param $size i32)
    EXPECT_EQ(2u, params.size());
    EXPECT_EQ(0u, results.size());

    u32 ptr = params[0].Get<u32>();
    u32 size = params[1].Get<u32>();

    EXPECT_LT(ptr + size, memory->ByteSize());

    string_data.resize(size);
    std::copy(memory->UnsafeData() + ptr, memory->UnsafeData() + ptr + size,
              string_data.begin());

    return Result::Ok;
  };
  auto buf_done_func = HostFunc::New(
      store_, FuncType{{ValueType::I32, ValueType::I32}, {}}, buf_done);

  Instantiate({memory->self(), fill_buf_func->self(), buf_done_func->self()});

  auto rot13 = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  ASSERT_EQ(Result::Ok, rot13->Call(store_, {}, results, &trap));

  ASSERT_EQ("Uryyb, JroNffrzoyl!", string_data);

  ASSERT_EQ(Result::Ok, rot13->Call(store_, {}, results, &trap));

  ASSERT_EQ("Hello, WebAssembly!", string_data);
}